

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opmath.cpp
# Opt level: O3

int32_t op_shift_right(int32_t value,int32_t amount)

{
  byte bVar1;
  int32_t iVar2;
  uint uVar3;
  
  uVar3 = value;
  if ((amount != 0) && (uVar3 = 0, -0x20 < amount && value != 0)) {
    if (amount < 0x20) {
      if (amount < 0) {
        iVar2 = op_shift_left(value,-amount);
        return iVar2;
      }
      if (value < 1) {
        bVar1 = (byte)amount & 0x1f;
        uVar3 = (uint)value >> bVar1 | -1 << 0x20 - bVar1;
      }
      else {
        uVar3 = (uint)value >> ((byte)amount & 0x1f);
      }
    }
    else {
      uVar3 = value >> 0x1f;
    }
  }
  return uVar3;
}

Assistant:

int32_t op_shift_right(int32_t value, int32_t amount)
{
	// Repeat the easy cases here to avoid INT_MIN funny business
	if (amount == 0)
		return value;
	if (value == 0 || amount <= -32)
		return 0;
	if (amount > 31)
		return (value < 0) ? -1 : 0;
	if (amount < 0)
		return op_shift_left(value, -amount);

	if (value > 0)
		return (uint32_t)value >> amount;

	// Calculate an OR mask for sign extension
	// 1->0x80000000, 2->0xC0000000, ..., 31->0xFFFFFFFE
	uint32_t amount_high_bits = -(UINT32_C(1) << (32 - amount));

	// The C++ standard leaves shifting right negative values
	// undefined, so use a left shift manually sign-extended
	return ((uint32_t)value >> amount) | amount_high_bits;
}